

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O0

void d(longlong g,int *y,int *mm,int *dd)

{
  int iVar1;
  undefined4 local_2c;
  int mi;
  int ddd;
  int *dd_local;
  int *mm_local;
  int *y_local;
  longlong g_local;
  
  *y = (int)((g * 10000 + 0x39bc) / 0x37bb49);
  local_2c = (int)g - (((*y * 0x16d + *y / 4) - *y / 100) + *y / 400);
  if (local_2c < 0) {
    *y = *y + -1;
    local_2c = (int)g - (((*y * 0x16d + *y / 4) - *y / 100) + *y / 400);
  }
  iVar1 = (local_2c * 100 + 0x34) / 0xbf4;
  *mm = (iVar1 + 2) % 0xc + 1;
  *y = *y + (iVar1 + 2) / 0xc;
  *dd = (local_2c - (iVar1 * 0x132 + 5) / 10) + 1;
  return;
}

Assistant:

void d(long long g, int &y, int &mm, int &dd)
{
	y = (10000 * g + 14780) / 3652425;
	int ddd = g - (365 * y + y / 4 - y / 100 + y / 400);
	if (ddd < 0) {
		y = y - 1;
		ddd = g - (365 * y + y / 4 - y / 100 + y / 400);
	}
	int mi = (100 * ddd + 52) / 3060;
	mm = (mi + 2) % 12 + 1;
	y = y + (mi + 2) / 12;
	dd = ddd - (mi * 306 + 5) / 10 + 1;
	return;
}